

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::Norm
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  TFad<6,_double> *pTVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint i;
  long lVar5;
  TFad<6,_double> *pTVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double adStack_90 [10];
  double local_40 [6];
  
  adStack_90[5] = 0.0;
  adStack_90[6] = 0.0;
  adStack_90[3] = 0.0;
  adStack_90[4] = 0.0;
  adStack_90[1] = 0.0;
  adStack_90[2] = 0.0;
  adStack_90[7] = 0.0;
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  dVar2 = 0.0;
  lVar5 = 0;
  pTVar6 = pTVar1;
  do {
    dVar10 = pTVar1[lVar5].val_;
    lVar7 = 2;
    do {
      dVar8 = pTVar6->dx_[lVar7 + -2] * dVar10;
      dVar9 = (pTVar6->dx_ + lVar7 + -2)[1] * dVar10;
      adStack_90[lVar7] = adStack_90[lVar7] + dVar8 + dVar8;
      adStack_90[lVar7 + 1] = adStack_90[lVar7 + 1] + dVar9 + dVar9;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 8);
    dVar2 = dVar2 + dVar10 * dVar10;
    lVar5 = lVar5 + 1;
    pTVar6 = pTVar6 + 1;
  } while (lVar5 != 6);
  dVar10 = pTVar1[1].val_;
  lVar5 = 2;
  do {
    dVar8 = pTVar1[1].dx_[lVar5 + -2] * dVar10;
    dVar9 = (pTVar1[1].dx_ + lVar5 + -2)[1] * dVar10;
    adStack_90[lVar5] = adStack_90[lVar5] + dVar8 + dVar8;
    adStack_90[lVar5 + 1] = adStack_90[lVar5 + 1] + dVar9 + dVar9;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  dVar8 = pTVar1[2].val_;
  lVar5 = 0;
  do {
    dVar9 = pTVar1[2].dx_[lVar5] * dVar8;
    dVar3 = (pTVar1[2].dx_ + lVar5)[1] * dVar8;
    adStack_90[lVar5 + 2] = adStack_90[lVar5 + 2] + dVar9 + dVar9;
    adStack_90[lVar5 + 3] = adStack_90[lVar5 + 3] + dVar3 + dVar3;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  dVar9 = pTVar1[4].val_;
  lVar5 = 0;
  do {
    dVar3 = pTVar1[4].dx_[lVar5] * dVar9;
    dVar4 = (pTVar1[4].dx_ + lVar5)[1] * dVar9;
    adStack_90[lVar5 + 2] = adStack_90[lVar5 + 2] + dVar3 + dVar3;
    adStack_90[lVar5 + 3] = adStack_90[lVar5 + 3] + dVar4 + dVar4;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  dVar10 = dVar10 * dVar10 + dVar2 + dVar8 * dVar8 + dVar9 * dVar9;
  local_40[4] = adStack_90[6];
  local_40[5] = adStack_90[7];
  local_40[2] = adStack_90[4];
  local_40[3] = adStack_90[5];
  local_40[0] = adStack_90[2];
  local_40[1] = adStack_90[3];
  (__return_storage_ptr__->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  dVar2 = SQRT(dVar10);
  if (dVar10 < 0.0) {
    dVar2 = sqrt(dVar10);
  }
  __return_storage_ptr__->val_ = dVar2;
  lVar5 = 2;
  do {
    dVar2 = adStack_90[lVar5 + 8];
    dVar8 = SQRT(dVar10);
    if (dVar10 < 0.0) {
      dVar8 = sqrt(dVar10);
    }
    __return_storage_ptr__->dx_[lVar5 + -2] = dVar2 / (dVar8 + dVar8);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::Norm() const {
    T norm = T(0.);
    for (unsigned int i = 0; i < 6; i++) {
        norm += fData[i] * fData[i];
    }
    norm += fData[_XY_] * fData[_XY_];
    norm += fData[_XZ_] * fData[_XZ_];
    norm += fData[_YZ_] * fData[_YZ_];
    return sqrt(norm);
}